

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall
GdlRuleTable::DebugRulePrecedence
          (GdlRuleTable *this,GrcManager *pcman,ostream *strmOut,int ipassBidi)

{
  pointer ppGVar1;
  ostream *poVar2;
  size_t ippass;
  ulong uVar3;
  GdlPass *this_00;
  string local_50;
  
  poVar2 = std::operator<<(strmOut,"\nTABLE: ");
  GrcSymbolTableEntry::FullName_abi_cxx11_(&local_50,this->m_psymName);
  poVar2 = std::operator<<(poVar2,(string *)&local_50);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_50);
  for (uVar3 = 0;
      ppGVar1 = (this->m_vppass).super__Vector_base<GdlPass_*,_std::allocator<GdlPass_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->m_vppass).
                            super__Vector_base<GdlPass_*,_std::allocator<GdlPass_*>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppGVar1 >> 3);
      uVar3 = uVar3 + 1) {
    this_00 = ppGVar1[uVar3];
    if (ipassBidi + -1 == this_00->m_nGlobalID) {
      poVar2 = std::operator<<(strmOut,"\nPASS ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,ipassBidi);
      std::operator<<(poVar2,": bidi\n");
      this_00 = (this->m_vppass).super__Vector_base<GdlPass_*,_std::allocator<GdlPass_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar3];
    }
    GdlPass::DebugRulePrecedence(this_00,pcman,strmOut);
  }
  return;
}

Assistant:

void GdlRuleTable::DebugRulePrecedence(GrcManager * pcman, std::ostream & strmOut, int ipassBidi)
{
	strmOut << "\nTABLE: " << m_psymName->FullName() << "\n";
	for (size_t ippass = 0; ippass < m_vppass.size(); ippass++)
	{
		if (ipassBidi - 1 == m_vppass[ippass]->GlobalID())
			strmOut << "\nPASS " << ipassBidi << ": bidi\n";

		m_vppass[ippass]->DebugRulePrecedence(pcman, strmOut);
	}
}